

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O2

size_t zt_binary_to_hex(void *data,size_t dlen,char *hex,size_t hlen)

{
  byte bVar1;
  size_t sVar2;
  char *dptr;
  ulong uVar3;
  
  uVar3 = 0;
  for (sVar2 = 0; (uVar3 < dlen && (sVar2 < hlen)); sVar2 = sVar2 + 2) {
    if (hex != (char *)0x0) {
      bVar1 = *(byte *)((long)data + uVar3);
      hex[sVar2] = "0123456789abcdef"[bVar1 >> 4];
      hex[sVar2 + 1] = "0123456789abcdef"[bVar1 & 0xf];
    }
    uVar3 = uVar3 + 1;
  }
  return sVar2;
}

Assistant:

size_t
zt_binary_to_hex(void *data, size_t dlen, char *hex, size_t hlen) {
    size_t n;
    char * dptr = hex;

    for (n = 0; (n < dlen) && ((n * 2) < hlen); n++, dptr += 2) {
        uint8_t c = ((uint8_t *)data)[n];
        if (hex != NULL) {
            dptr[0] = HEX_DIGITS[((c >> 4) & 0xF)];
            dptr[1] = HEX_DIGITS[(c & 0xF)];
        }
    }
    return n * 2;
}